

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx-call-f.cpp
# Opt level: O0

int main(void)

{
  undefined4 *puVar1;
  int *a;
  
  puVar1 = (undefined4 *)operator_new__(0xc);
  *puVar1 = 0;
  puVar1[1] = 1;
  puVar1[2] = 2;
  print_1d(3,puVar1);
  return 0;
}

Assistant:

int main() {

  int *a;
  a = NULL;
  a = new int[3];
  a[0] = 0;
  a[1] = 1;
  a[2] = 2;
  print_1d(3, a);

  return 0;
}